

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<float,_gimage::PixelTraits<float>_> *
gimage::cropImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,long x,long y,long w,long h)

{
  long h_00;
  long i;
  long lVar1;
  int d;
  long lVar2;
  long k;
  long lVar3;
  work_t wVar4;
  
  if (w < 1) {
    w = 0;
  }
  h_00 = 0;
  if (0 < h) {
    h_00 = h;
  }
  Image<float,_gimage::PixelTraits<float>_>::Image(__return_storage_ptr__,w,h_00,image->depth);
  if ((((y | x) < 0) || (image->width < w + x)) || (image->height < y + h_00)) {
    for (lVar2 = 0; lVar2 < image->depth; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 != h_00; lVar3 = lVar3 + 1) {
        for (lVar1 = 0; w != lVar1; lVar1 = lVar1 + 1) {
          wVar4 = Image<float,_gimage::PixelTraits<float>_>::getBoundsInv
                            (image,lVar1 + x,lVar3 + y,(int)lVar2);
          __return_storage_ptr__->img[lVar2][lVar3][lVar1] = wVar4;
        }
      }
    }
  }
  else {
    for (lVar2 = 0; lVar2 < image->depth; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; h_00 != lVar3; lVar3 = lVar3 + 1) {
        memcpy(__return_storage_ptr__->img[lVar2][lVar3],image->img[lVar2][y + lVar3] + x,w << 2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}